

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionResponsePdu.cpp
# Opt level: O0

void __thiscall DIS::ActionResponsePdu::unmarshal(ActionResponsePdu *this,DataStream *dataStream)

{
  undefined1 local_78 [8];
  VariableDatum x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  FixedDatum x;
  size_t idx;
  DataStream *dataStream_local;
  ActionResponsePdu *this_local;
  
  SimulationManagementFamilyPdu::unmarshal(&this->super_SimulationManagementFamilyPdu,dataStream);
  DataStream::operator>>(dataStream,&this->_requestID);
  DataStream::operator>>(dataStream,&this->_requestStatus);
  DataStream::operator>>(dataStream,&this->_numberOfFixedDatumRecords);
  DataStream::operator>>(dataStream,&this->_numberOfVariableDatumRecords);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::clear(&this->_fixedDatums);
  x._fixedDatumID = 0;
  x._fixedDatumValue = 0;
  for (; (ulong)x._8_8_ < (ulong)this->_numberOfFixedDatumRecords; x._8_8_ = x._8_8_ + 1) {
    FixedDatum::FixedDatum((FixedDatum *)local_30);
    FixedDatum::unmarshal((FixedDatum *)local_30,dataStream);
    std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::push_back
              (&this->_fixedDatums,(value_type *)local_30);
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
  }
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatums);
  x_1._arrayLength = 0;
  x_1._44_4_ = 0;
  for (; (ulong)x_1._40_8_ < (ulong)this->_numberOfVariableDatumRecords; x_1._40_8_ = x_1._40_8_ + 1
      ) {
    VariableDatum::VariableDatum((VariableDatum *)local_78);
    VariableDatum::unmarshal((VariableDatum *)local_78,dataStream);
    std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::push_back
              (&this->_variableDatums,(value_type *)local_78);
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
  }
  return;
}

Assistant:

void ActionResponsePdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _requestID;
    dataStream >> _requestStatus;
    dataStream >> _numberOfFixedDatumRecords;
    dataStream >> _numberOfVariableDatumRecords;

     _fixedDatums.clear();
     for(size_t idx = 0; idx < _numberOfFixedDatumRecords; idx++)
     {
        FixedDatum x;
        x.unmarshal(dataStream);
        _fixedDatums.push_back(x);
     }

     _variableDatums.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatumRecords; idx++)
     {
        VariableDatum x;
        x.unmarshal(dataStream);
        _variableDatums.push_back(x);
     }
}